

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

uint64_t __thiscall doublechecked::Roaring::or_cardinality(Roaring *this,Roaring *r)

{
  uint uVar1;
  bool bVar2;
  reference puVar3;
  reference puVar4;
  char *expression;
  uint64_t count;
  iterator r_it_end;
  iterator r_it;
  iterator it_end;
  iterator it;
  uint64_t ans;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  unsigned_long in_stack_ffffffffffffff80;
  uint64_t result;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  uint64_t local_18;
  
  local_18 = roaring::Roaring::or_cardinality
                       ((Roaring *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (Roaring *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_20._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_30._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_38._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  bVar2 = std::operator==(&local_20,&local_28);
  if (bVar2) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x10ea2e
              );
    _assert_true(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c);
  }
  else {
    bVar2 = std::operator==(&local_30,&local_38);
    if (bVar2) {
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 0x10ea90);
      _assert_true(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c);
    }
    else {
      puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                         ((_Rb_tree_const_iterator<unsigned_int> *)0x10eacc);
      uVar1 = *puVar3;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::rbegin
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      puVar4 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_>::operator*
                         ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      bVar2 = true;
      if (uVar1 <= *puVar4) {
        puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                           ((_Rb_tree_const_iterator<unsigned_int> *)0x10eb0d);
        uVar1 = *puVar3;
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::rbegin
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        puVar4 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_>::operator*
                           ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_> *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        bVar2 = *puVar4 < uVar1;
      }
      if (bVar2) {
        result = local_18;
        expression = (char *)std::
                             set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             ::size((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)0x10eb65);
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   0x10eb7b);
        _assert_true(result,expression,
                     (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c);
      }
      else {
        while( true ) {
          bVar2 = std::operator!=(&local_20,&local_28);
          in_stack_ffffffffffffff74 = CONCAT13(1,(int3)in_stack_ffffffffffffff74);
          if (!bVar2) {
            bVar2 = std::operator!=(&local_30,&local_38);
            in_stack_ffffffffffffff74 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff74);
          }
          if ((char)((uint)in_stack_ffffffffffffff74 >> 0x18) == '\0') break;
          bVar2 = std::operator==(&local_20,&local_28);
          if (bVar2) {
            std::_Rb_tree_const_iterator<unsigned_int>::operator++
                      ((_Rb_tree_const_iterator<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          }
          else {
            bVar2 = std::operator==(&local_30,&local_38);
            if (bVar2) {
              std::_Rb_tree_const_iterator<unsigned_int>::operator++
                        ((_Rb_tree_const_iterator<unsigned_int> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
            }
            else {
              puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                                 ((_Rb_tree_const_iterator<unsigned_int> *)0x10ec57);
              in_stack_ffffffffffffff70 = *puVar3;
              puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                                 ((_Rb_tree_const_iterator<unsigned_int> *)0x10ec67);
              if (in_stack_ffffffffffffff70 == *puVar3) {
                std::_Rb_tree_const_iterator<unsigned_int>::operator++
                          ((_Rb_tree_const_iterator<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
                std::_Rb_tree_const_iterator<unsigned_int>::operator++
                          ((_Rb_tree_const_iterator<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
              }
              else {
                puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                                   ((_Rb_tree_const_iterator<unsigned_int> *)0x10ec92);
                in_stack_ffffffffffffff6c = *puVar3;
                puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                                   ((_Rb_tree_const_iterator<unsigned_int> *)0x10eca2);
                if (in_stack_ffffffffffffff6c < *puVar3) {
                  std::_Rb_tree_const_iterator<unsigned_int>::operator++
                            ((_Rb_tree_const_iterator<unsigned_int> *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
                }
                else {
                  std::_Rb_tree_const_iterator<unsigned_int>::operator++
                            ((_Rb_tree_const_iterator<unsigned_int> *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
                }
              }
            }
          }
        }
        _assert_true(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c);
      }
    }
  }
  return local_18;
}

Assistant:

uint64_t or_cardinality(const Roaring &r) const {
        uint64_t ans = plain.or_cardinality(r.plain);

        auto it = check.begin();
        auto it_end = check.end();
        auto r_it = r.check.begin();
        auto r_it_end = r.check.end();
        if (it == it_end) {
            assert_true(ans == r.check.size());
        }  // this empty
        else if (r_it == r_it_end) {
            assert_true(ans == check.size());
        }  // r empty
        else if (*it > *r.check.rbegin() || *r_it > *check.rbegin()) {
            assert_true(ans ==
                        check.size() + r.check.size());  // obvious disjoint
        } else {
            uint64_t count = 0;
            while (it != it_end || r_it != r_it_end) {
                ++count;  // note matching case counts once but bumps both
                if (it == it_end) {
                    ++r_it;
                } else if (r_it == r_it_end) {
                    ++it;
                } else if (*it == *r_it) {
                    ++it;
                    ++r_it;
                }  // matching case
                else if (*it < *r_it) {
                    ++it;
                } else {
                    ++r_it;
                }
            }
            assert_true(ans == count);
        }

        return ans;
    }